

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fFirst)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  Vec_Int_t *pVVar4;
  int local_34;
  int Diff;
  int i;
  int iFanout;
  int fFirst_local;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vTfo_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjTravIdDiff(p,iObj);
  iVar2 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar2 == 0) {
    if (iVar1 == 2) {
      Vec_IntPush(vRoots,iObj);
      Vec_IntPush(vTfo,iObj);
    }
    else {
      if (iVar1 != 1) {
        __assert_fail("Diff == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x272,
                      "void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int)");
      }
      local_34 = 0;
      while( true ) {
        pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
        iVar1 = Vec_IntSize(pVVar4);
        if (iVar1 <= local_34) break;
        pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
        iVar1 = Vec_IntEntry(pVVar4,local_34);
        AVar3 = Acb_ObjType(p,iVar1);
        if ((AVar3 != ABC_OPER_NONE) &&
           ((fFirst == 0 || (iVar2 = Acb_ObjIsDelayCriticalFanin(p,iVar1,iObj), iVar2 != 0)))) {
          Acb_ObjDeriveTfo_rec(p,iVar1,vTfo,vRoots,0);
        }
        local_34 = local_34 + 1;
      }
      Vec_IntPush(vTfo,iObj);
    }
  }
  return;
}

Assistant:

void Acb_ObjDeriveTfo_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fFirst )
{
    int iFanout, i, Diff = Acb_ObjTravIdDiff(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Diff == 2 ) // root
    {
        Vec_IntPush( vRoots, iObj );
        Vec_IntPush( vTfo, iObj );
        return;
    }
    assert( Diff == 1 );
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            Acb_ObjDeriveTfo_rec( p, iFanout, vTfo, vRoots, 0 );
    Vec_IntPush( vTfo, iObj );
}